

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_artifacts(void)

{
  undefined8 in_RAX;
  char *message;
  wchar_t wVar1;
  ulong uVar2;
  uint8_t tmp8u;
  undefined8 uStack_28;
  uint16_t tmp16u;
  
  uStack_28 = in_RAX;
  rd_u16b(&tmp16u);
  if (z_info->a_max < tmp16u) {
    message = format("Too many (%u) artifacts!",(ulong)tmp16u);
    note(message);
    wVar1 = L'\xffffffff';
  }
  else {
    wVar1 = L'\0';
    for (uVar2 = 0; uVar2 < tmp16u; uVar2 = uVar2 + 1) {
      rd_byte(&tmp8u);
      aup_info[uVar2].created = tmp8u != '\0';
      rd_byte(&tmp8u);
      aup_info[uVar2].seen = tmp8u != '\0';
      rd_byte(&tmp8u);
      aup_info[uVar2].everseen = tmp8u != '\0';
      rd_byte(&tmp8u);
    }
  }
  return wVar1;
}

Assistant:

int rd_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Load the Artifacts */
	rd_u16b(&tmp16u);
	if (tmp16u > z_info->a_max) {
		note(format("Too many (%u) artifacts!", tmp16u));
		return (-1);
	}

	/* Read the artifact flags */
	for (i = 0; i < tmp16u; i++) {
		uint8_t tmp8u;

		rd_byte(&tmp8u);
		aup_info[i].created = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].seen = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].everseen = tmp8u ? true : false;
		rd_byte(&tmp8u);
	}

	return 0;
}